

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

char * archive_acl_to_text_l
                 (archive_acl *acl,ssize_t *text_len,wchar_t flags,archive_string_conv *sc)

{
  wchar_t wVar1;
  int *piVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  archive_acl_entry *paVar7;
  wchar_t want_type;
  char *local_70;
  undefined4 local_64;
  size_t *local_60;
  char *local_58;
  size_t local_50;
  archive_string_conv *local_48;
  char *name;
  size_t len;
  
  if ((acl->acl_types & 0x3c00U) == 0) {
    want_type = flags & 0x300;
    if ((want_type == L'\0') || (want_type == L'̀')) {
      flags = flags | 2;
      want_type = L'̀';
    }
  }
  else {
    if ((acl->acl_types & 0x300U) != 0) {
      return (char *)0x0;
    }
    want_type = L'㰀';
  }
  local_50 = archive_acl_text_len(acl,want_type,flags,L'\0',(archive *)0x0,sc);
  if (local_50 != 0) {
    local_64 = 0x2c;
    if ((flags & 8U) == 0) {
      local_64 = 10;
    }
    local_70 = (char *)malloc(local_50);
    local_58 = local_70;
    if (local_70 == (char *)0x0) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xc) {
        return (char *)0x0;
      }
      pcVar6 = "No memory";
    }
    else {
      iVar5 = 0;
      local_60 = (size_t *)text_len;
      local_48 = sc;
      if (((uint)want_type >> 8 & 1) != 0) {
        append_entry(&local_70,(char *)0x0,L'Ā',L'✒',flags,(char *)0x0,acl->mode & 0x1c0,
                     L'\xffffffff');
        cVar4 = (char)local_64;
        *local_70 = cVar4;
        local_70 = local_70 + 1;
        append_entry(&local_70,(char *)0x0,L'Ā',L'✔',flags,(char *)0x0,acl->mode & 0x38,
                     L'\xffffffff');
        *local_70 = cVar4;
        local_70 = local_70 + 1;
        append_entry(&local_70,(char *)0x0,L'Ā',L'✖',flags,(char *)0x0,acl->mode & 7,
                     L'\xffffffff');
        iVar5 = 3;
      }
      paVar7 = acl->acl_head;
      if (paVar7 != (archive_acl_entry *)0x0) {
        do {
          wVar1 = paVar7->type;
          if (((wVar1 & want_type) != 0) &&
             (((wVar1 != L'Ā' || (uVar3 = paVar7->tag + L'\xffffd8ee', 4 < uVar3)) ||
              ((0x15U >> (uVar3 & 0x1f) & 1) == 0)))) {
            pcVar6 = (char *)0x0;
            if (wVar1 == L'Ȁ') {
              pcVar6 = "default:";
            }
            if ((flags & 2U) == 0) {
              pcVar6 = (char *)0x0;
            }
            wVar1 = archive_mstring_get_mbs_l(&paVar7->name,&name,&len,local_48);
            if (wVar1 != L'\0') {
              return (char *)0x0;
            }
            if (0 < iVar5) {
              *local_70 = (char)local_64;
              local_70 = local_70 + 1;
            }
            wVar1 = L'\xffffffff';
            if ((flags & 1U) != 0 || name == (char *)0x0) {
              wVar1 = paVar7->id;
            }
            append_entry(&local_70,pcVar6,paVar7->type,paVar7->tag,flags,name,paVar7->permset,wVar1)
            ;
            iVar5 = iVar5 + 1;
          }
          paVar7 = paVar7->next;
        } while (paVar7 != (archive_acl_entry *)0x0);
      }
      pcVar6 = local_58;
      *local_70 = '\0';
      len = strlen(local_58);
      if ((long)len < (long)local_50) {
        if (local_60 != (size_t *)0x0) {
          *local_60 = len;
          return pcVar6;
        }
        return pcVar6;
      }
      pcVar6 = "Buffer overrun";
    }
    __archive_errx(1,pcVar6);
  }
  return (char *)0x0;
}

Assistant:

char *
archive_acl_to_text_l(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive_string_conv *sc)
{
	int count;
	ssize_t length;
	size_t len;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	char *p, *s;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 0, NULL, sc);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = ',';
	else
		separator = '\n';

	/* Now, allocate the string and actually populate it. */
	p = s = (char *)malloc(length * sizeof(char));
	if (p == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = "default:";
		else
			prefix = NULL;
		r = archive_mstring_get_mbs_l(
		    &ap->name, &name, &len, sc);
		if (r != 0)
			return (NULL);
		if (count > 0)
			*p++ = separator;
		if (name == NULL ||
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)) {
			id = ap->id;
		} else {
			id = -1;
		}
		append_entry(&p, prefix, ap->type, ap->tag, flags, name,
		    ap->permset, id);
		count++;
	}

	/* Add terminating character */
	*p++ = '\0';

	len = strlen(s);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (s);
}